

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall miniros::Subscription::~Subscription(Subscription *this)

{
  this->_vptr_Subscription = (_func_int **)&PTR__Subscription_002f1c00;
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::clear(&(this->pending_connections_)._M_t);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::clear(&this->callbacks_);
  std::
  vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
  ::~vector(&this->cached_deserializers_);
  std::
  _Rb_tree<std::shared_ptr<miniros::PublisherLink>,_std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>,_std::_Select1st<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
  ::~_Rb_tree(&(this->latched_messages_)._M_t);
  StatisticsLogger::~StatisticsLogger(&this->statistics_);
  TransportHints::~TransportHints(&this->transport_hints_);
  std::
  vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
  ::~vector(&this->publisher_links_);
  std::
  _Rb_tree<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::shared_ptr<miniros::Subscription::PendingConnection>,_std::_Identity<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::~_Rb_tree(&(this->pending_connections_)._M_t);
  std::
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  ::~vector(&this->callbacks_);
  std::__cxx11::string::~string((string *)&this->datatype_);
  std::__cxx11::string::~string((string *)&this->md5sum_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
              super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Subscription::~Subscription()
{
  pending_connections_.clear();
  callbacks_.clear();
}